

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeBooleanConstructor
               (DynamicObject *booleanConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *this;
  PropertyString *pPVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,booleanConstructor,mode,3,0);
  pJVar1 = (((booleanConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(booleanConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (booleanConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(booleanConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (booleanConstructor,0x124,(pJVar1->super_JavascriptLibraryBase).booleanPrototype.ptr,0,0
             ,0,0);
  pPVar2 = ScriptContext::GetPropertyString(this,0x58);
  (*(booleanConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (booleanConstructor,0x106,pPVar2,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(booleanConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeBooleanConstructor(DynamicObject* booleanConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(booleanConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterBoolean
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = booleanConstructor->GetScriptContext();
        JavascriptLibrary* library = booleanConstructor->GetLibrary();
        library->AddMember(booleanConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(booleanConstructor, PropertyIds::prototype, library->booleanPrototype, PropertyNone);
        library->AddMember(booleanConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Boolean), PropertyConfigurable);

        booleanConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }